

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O0

void test_AString_split_multipleDelimiters_fn(int _i)

{
  AString string_00;
  int iVar1;
  ASplittedString *splitted_00;
  size_t sVar2;
  char *in_stack_fffffffffffffcf0;
  uintmax_t _ck_y_22;
  uintmax_t _ck_x_30;
  uintmax_t _ck_y_21;
  uintmax_t _ck_x_29;
  char *_ck_y_q_6;
  char *_ck_x_q_6;
  char *_ck_y_s_6;
  char *_ck_x_s_6;
  char *_ck_y_20;
  char *_ck_x_28;
  void *_ck_x_27;
  uintmax_t _ck_y_19;
  uintmax_t _ck_x_26;
  uintmax_t _ck_y_18;
  uintmax_t _ck_x_25;
  char *_ck_y_q_5;
  char *_ck_x_q_5;
  char *_ck_y_s_5;
  char *_ck_x_s_5;
  char *_ck_y_17;
  char *_ck_x_24;
  void *_ck_x_23;
  uintmax_t _ck_y_16;
  uintmax_t _ck_x_22;
  uintmax_t _ck_y_15;
  uintmax_t _ck_x_21;
  char *_ck_y_q_4;
  char *_ck_x_q_4;
  char *_ck_y_s_4;
  char *_ck_x_s_4;
  char *_ck_y_14;
  char *_ck_x_20;
  void *_ck_x_19;
  uintmax_t _ck_y_13;
  uintmax_t _ck_x_18;
  uintmax_t _ck_y_12;
  uintmax_t _ck_x_17;
  char *_ck_y_q_3;
  char *_ck_x_q_3;
  char *_ck_y_s_3;
  char *_ck_x_s_3;
  char *_ck_y_11;
  char *_ck_x_16;
  void *_ck_x_15;
  uintmax_t _ck_y_10;
  uintmax_t _ck_x_14;
  uintmax_t _ck_y_9;
  uintmax_t _ck_x_13;
  char *_ck_y_q_2;
  char *_ck_x_q_2;
  char *_ck_y_s_2;
  char *_ck_x_s_2;
  char *_ck_y_8;
  char *_ck_x_12;
  void *_ck_x_11;
  uintmax_t _ck_y_7;
  uintmax_t _ck_x_10;
  uintmax_t _ck_y_6;
  uintmax_t _ck_x_9;
  char *_ck_y_q_1;
  char *_ck_x_q_1;
  char *_ck_y_s_1;
  char *_ck_x_s_1;
  char *_ck_y_5;
  char *_ck_x_8;
  void *_ck_x_7;
  uintmax_t _ck_y_4;
  uintmax_t _ck_x_6;
  uintmax_t _ck_y_3;
  uintmax_t _ck_x_5;
  void *_ck_x_4;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_3;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_1;
  char *_ck_x_2;
  void *_ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  ASplittedString *splitted;
  AString string;
  int _i_local;
  
  string.buffer._4_4_ = _i;
  private_ACUtilsTest_AString_constructTestString((AString *)&splitted,";01;;23;",8);
  private_ACUtilsTest_AString_setReallocFail(false,0);
  splitted_00 = AString_split((AString *)&splitted,';',false);
  if (string.size != 8) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa2a,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","(string).capacity == (8)",
                      "(string).capacity",string.size,"(8)",8,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0xa2a);
  if (string.capacity == 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa2a,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) (string).buffer != NULL",
                      "(void*) (string).buffer",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0xa2a);
  _ck_y_s = (char *)string.capacity;
  if (string.capacity == 0) {
    _ck_y_q = "";
    _ck_y_s = "(null)";
  }
  else {
    _ck_y_q = "\"";
    iVar1 = strcmp(";01;;23;",(char *)string.capacity);
    if (iVar1 == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa2a);
      if (string.deallocator != (ACUtilsDeallocator)0x8) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0xa2a,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(string).size == strlen(\";01;;23;\")","(string).size",string.deallocator
                          ,"strlen(\";01;;23;\")",8,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa2a);
      if (splitted_00 == (ASplittedString *)0x0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0xa2b,"Assertion \'_ck_x != NULL\' failed",
                          "Assertion \'%s\' failed: %s == %#x","(void*) splitted != NULL",
                          "(void*) splitted",0,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa2b);
      sVar2 = private_ACUtils_ADynArray_size(splitted_00);
      if (sVar2 != 5) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0xa2c,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "private_ACUtils_ADynArray_size(splitted) == 5",
                          "private_ACUtils_ADynArray_size(splitted)",sVar2,"5",5,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa2c);
      sVar2 = (*splitted_00->buffer)->capacity;
      if (sVar2 == 8) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0xa2d);
        if ((*splitted_00->buffer)->buffer == (char *)0x0) {
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0xa2d,"Assertion \'_ck_x != NULL\' failed",
                            "Assertion \'%s\' failed: %s == %#x",
                            "(void*) (*(splitted->buffer[0])).buffer != NULL",
                            "(void*) (*(splitted->buffer[0])).buffer",0,0);
        }
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0xa2d);
        _ck_y_s_1 = (*splitted_00->buffer)->buffer;
        if (_ck_y_s_1 == (char *)0x0) {
          _ck_y_q_1 = "";
          _ck_y_s_1 = "(null)";
        }
        else {
          _ck_y_q_1 = "\"";
          iVar1 = strcmp("",_ck_y_s_1);
          if (iVar1 == 0) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0xa2d);
            sVar2 = (*splitted_00->buffer)->size;
            if (sVar2 != 0) {
              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0xa2d,"Assertion \'_ck_x == _ck_y\' failed",
                                "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                "(*(splitted->buffer[0])).size == strlen(\"\")",
                                "(*(splitted->buffer[0])).size",sVar2,"strlen(\"\")",0,0);
            }
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0xa2d);
            sVar2 = splitted_00->buffer[1]->capacity;
            if (sVar2 != 8) {
              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0xa2e,"Assertion \'_ck_x == _ck_y\' failed",
                                "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                "(*(splitted->buffer[1])).capacity == (8)",
                                "(*(splitted->buffer[1])).capacity",sVar2,"(8)",8,0);
            }
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0xa2e);
            if (splitted_00->buffer[1]->buffer == (char *)0x0) {
              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0xa2e,"Assertion \'_ck_x != NULL\' failed",
                                "Assertion \'%s\' failed: %s == %#x",
                                "(void*) (*(splitted->buffer[1])).buffer != NULL",
                                "(void*) (*(splitted->buffer[1])).buffer",0,0);
            }
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0xa2e);
            _ck_y_s_2 = splitted_00->buffer[1]->buffer;
            if (_ck_y_s_2 == (char *)0x0) {
              _ck_y_q_2 = "";
              _ck_y_s_2 = "(null)";
            }
            else {
              _ck_y_q_2 = "\"";
              iVar1 = strcmp("01",_ck_y_s_2);
              if (iVar1 == 0) {
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0xa2e);
                sVar2 = splitted_00->buffer[1]->size;
                if (sVar2 != 2) {
                  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                    ,0xa2e,"Assertion \'_ck_x == _ck_y\' failed",
                                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                    "(*(splitted->buffer[1])).size == strlen(\"01\")",
                                    "(*(splitted->buffer[1])).size",sVar2,"strlen(\"01\")",2,0);
                }
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0xa2e);
                sVar2 = splitted_00->buffer[2]->capacity;
                if (sVar2 != 8) {
                  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                    ,0xa2f,"Assertion \'_ck_x == _ck_y\' failed",
                                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                    "(*(splitted->buffer[2])).capacity == (8)",
                                    "(*(splitted->buffer[2])).capacity",sVar2,"(8)",8,0);
                }
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0xa2f);
                if (splitted_00->buffer[2]->buffer == (char *)0x0) {
                  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                    ,0xa2f,"Assertion \'_ck_x != NULL\' failed",
                                    "Assertion \'%s\' failed: %s == %#x",
                                    "(void*) (*(splitted->buffer[2])).buffer != NULL",
                                    "(void*) (*(splitted->buffer[2])).buffer",0,0);
                }
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0xa2f);
                _ck_y_s_3 = splitted_00->buffer[2]->buffer;
                if (_ck_y_s_3 == (char *)0x0) {
                  _ck_y_q_3 = "";
                  _ck_y_s_3 = "(null)";
                }
                else {
                  _ck_y_q_3 = "\"";
                  iVar1 = strcmp("",_ck_y_s_3);
                  if (iVar1 == 0) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0xa2f);
                    sVar2 = splitted_00->buffer[2]->size;
                    if (sVar2 != 0) {
                      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0xa2f,"Assertion \'_ck_x == _ck_y\' failed",
                                        "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                        "(*(splitted->buffer[2])).size == strlen(\"\")",
                                        "(*(splitted->buffer[2])).size",sVar2,"strlen(\"\")",0,0);
                    }
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0xa2f);
                    sVar2 = splitted_00->buffer[3]->capacity;
                    if (sVar2 != 8) {
                      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0xa30,"Assertion \'_ck_x == _ck_y\' failed",
                                        "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                        "(*(splitted->buffer[3])).capacity == (8)",
                                        "(*(splitted->buffer[3])).capacity",sVar2,"(8)",8,0);
                    }
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0xa30);
                    if (splitted_00->buffer[3]->buffer == (char *)0x0) {
                      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0xa30,"Assertion \'_ck_x != NULL\' failed",
                                        "Assertion \'%s\' failed: %s == %#x",
                                        "(void*) (*(splitted->buffer[3])).buffer != NULL",
                                        "(void*) (*(splitted->buffer[3])).buffer",0,0);
                    }
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0xa30);
                    _ck_y_s_4 = splitted_00->buffer[3]->buffer;
                    if (_ck_y_s_4 == (char *)0x0) {
                      _ck_y_q_4 = "";
                      _ck_y_s_4 = "(null)";
                    }
                    else {
                      _ck_y_q_4 = "\"";
                      iVar1 = strcmp("23",_ck_y_s_4);
                      if (iVar1 == 0) {
                        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                    ,0xa30);
                        sVar2 = splitted_00->buffer[3]->size;
                        if (sVar2 != 2) {
                          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                            ,0xa30,"Assertion \'_ck_x == _ck_y\' failed",
                                            "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                            "(*(splitted->buffer[3])).size == strlen(\"23\")",
                                            "(*(splitted->buffer[3])).size",sVar2,"strlen(\"23\")",2
                                            ,0);
                        }
                        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                    ,0xa30);
                        sVar2 = splitted_00->buffer[4]->capacity;
                        if (sVar2 != 8) {
                          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                            ,0xa31,"Assertion \'_ck_x == _ck_y\' failed",
                                            "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                            "(*(splitted->buffer[4])).capacity == (8)",
                                            "(*(splitted->buffer[4])).capacity",sVar2,"(8)",8,0);
                        }
                        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                    ,0xa31);
                        if (splitted_00->buffer[4]->buffer == (char *)0x0) {
                          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                            ,0xa31,"Assertion \'_ck_x != NULL\' failed",
                                            "Assertion \'%s\' failed: %s == %#x",
                                            "(void*) (*(splitted->buffer[4])).buffer != NULL",
                                            "(void*) (*(splitted->buffer[4])).buffer",0,0);
                        }
                        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                    ,0xa31);
                        _ck_y_s_5 = splitted_00->buffer[4]->buffer;
                        if (_ck_y_s_5 == (char *)0x0) {
                          _ck_y_q_5 = "";
                          _ck_y_s_5 = "(null)";
                        }
                        else {
                          _ck_y_q_5 = "\"";
                          iVar1 = strcmp("",_ck_y_s_5);
                          if (iVar1 == 0) {
                            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0xa31);
                            sVar2 = splitted_00->buffer[4]->size;
                            if (sVar2 != 0) {
                              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                ,0xa31,"Assertion \'_ck_x == _ck_y\' failed",
                                                "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                                "(*(splitted->buffer[4])).size == strlen(\"\")",
                                                "(*(splitted->buffer[4])).size",sVar2,"strlen(\"\")"
                                                ,0,0);
                            }
                            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0xa31);
                            AString_freeSplitted(splitted_00);
                            if (string.size != 8) {
                              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                ,0xa33,"Assertion \'_ck_x == _ck_y\' failed",
                                                "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                                "(string).capacity == (8)","(string).capacity",
                                                string.size,"(8)",8,0);
                            }
                            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0xa33);
                            if (string.capacity == 0) {
                              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                ,0xa33,"Assertion \'_ck_x != NULL\' failed",
                                                "Assertion \'%s\' failed: %s == %#x",
                                                "(void*) (string).buffer != NULL",
                                                "(void*) (string).buffer",0,0);
                            }
                            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0xa33);
                            _ck_y_s_6 = (char *)string.capacity;
                            if (string.capacity == 0) {
                              _ck_y_q_6 = "";
                              _ck_y_s_6 = "(null)";
                            }
                            else {
                              _ck_y_q_6 = "\"";
                              iVar1 = strcmp(";01;;23;",(char *)string.capacity);
                              if (iVar1 == 0) {
                                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                            ,0xa33);
                                if (string.deallocator != (ACUtilsDeallocator)0x8) {
                                  _ck_assert_failed(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0xa33,"Assertion \'_ck_x == _ck_y\' failed",
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                                  "(string).size == strlen(\";01;;23;\")",
                                                  "(string).size",string.deallocator,
                                                  "strlen(\";01;;23;\")",8,0);
                                }
                                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                            ,0xa33);
                                if (private_ACUtilsTest_AString_reallocCount ==
                                    private_ACUtilsTest_AString_freeCount) {
                                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0xa34);
                                  string_00.deallocator = string.deallocator;
                                  string_00.reallocator = string.reallocator;
                                  string_00.size = string.size;
                                  string_00.capacity = string.capacity;
                                  string_00.buffer = in_stack_fffffffffffffcf0;
                                  private_ACUtilsTest_AString_destructTestString(string_00);
                                  return;
                                }
                                _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0xa34,"Assertion \'_ck_x == _ck_y\' failed",
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                                  "private_ACUtilsTest_AString_reallocCount == (private_ACUtilsTest_AString_freeCount)"
                                                  ,"private_ACUtilsTest_AString_reallocCount",
                                                  private_ACUtilsTest_AString_reallocCount,
                                                  "(private_ACUtilsTest_AString_freeCount)",
                                                  private_ACUtilsTest_AString_freeCount,0);
                              }
                            }
                            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0xa33,
                                              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                              ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s"
                                              ,"(string).buffer == (\";01;;23;\")","(string).buffer"
                                              ,_ck_y_q_6,_ck_y_s_6,_ck_y_q_6,"(\";01;;23;\")","\"",
                                              ";01;;23;","\"",0);
                          }
                        }
                        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                          ,0xa31,
                                          "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                          ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                                          "(*(splitted->buffer[4])).buffer == (\"\")",
                                          "(*(splitted->buffer[4])).buffer",_ck_y_q_5,_ck_y_s_5,
                                          _ck_y_q_5,"(\"\")","\"","","\"",0);
                      }
                    }
                    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0xa30,
                                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                      ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                                      "(*(splitted->buffer[3])).buffer == (\"23\")",
                                      "(*(splitted->buffer[3])).buffer",_ck_y_q_4,_ck_y_s_4,
                                      _ck_y_q_4,"(\"23\")","\"","23","\"",0);
                  }
                }
                _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0xa2f,
                                  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                  ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                                  "(*(splitted->buffer[2])).buffer == (\"\")",
                                  "(*(splitted->buffer[2])).buffer",_ck_y_q_3,_ck_y_s_3,_ck_y_q_3,
                                  "(\"\")","\"","","\"",0);
              }
            }
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0xa2e,
                              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                              ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                              "(*(splitted->buffer[1])).buffer == (\"01\")",
                              "(*(splitted->buffer[1])).buffer",_ck_y_q_2,_ck_y_s_2,_ck_y_q_2,
                              "(\"01\")","\"","01","\"",0);
          }
        }
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0xa2d,
                          "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                          ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                          "(*(splitted->buffer[0])).buffer == (\"\")",
                          "(*(splitted->buffer[0])).buffer",_ck_y_q_1,_ck_y_s_1,_ck_y_q_1,"(\"\")",
                          "\"","","\"",0);
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0xa2d,"Assertion \'_ck_x == _ck_y\' failed",
                        "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                        "(*(splitted->buffer[0])).capacity == (8)",
                        "(*(splitted->buffer[0])).capacity",sVar2,"(8)",8,0);
    }
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0xa2a,
                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                    "(string).buffer == (\";01;;23;\")","(string).buffer",_ck_y_q,_ck_y_s,_ck_y_q,
                    "(\";01;;23;\")","\"",";01;;23;","\"",0);
}

Assistant:

END_TEST
START_TEST(test_AString_split_multipleDelimiters)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString(";01;;23;", 8);
    struct ASplittedString *splitted;
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    splitted = AString_split(&string, ';', false);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, ";01;;23;", 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(splitted);
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_size(splitted), 5);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 0), "", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 1), "01", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 2), "", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 3), "23", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 4), "", 8);
    AString_freeSplitted(splitted);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, ";01;;23;", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(private_ACUtilsTest_AString_freeCount);
    private_ACUtilsTest_AString_destructTestString(string);
}